

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_mapping_value_epilog
               (fy_emitter *emit,fy_emit_save_ctx *sc,_Bool last,fy_token *fyt_value)

{
  _Bool _Var1;
  fy_token *fyt_value_local;
  _Bool last_local;
  fy_emit_save_ctx *sc_local;
  fy_emitter *emit_local;
  
  if ((((*(byte *)sc >> 1 & 1) != 0) || (_Var1 = fy_emit_is_json_mode(emit), _Var1)) && (!last)) {
    fy_emit_write_indicator(emit,di_comma,sc->flags,sc->indent,fyewt_indicator);
  }
  fy_emit_token_comment(emit,fyt_value,sc->flags,sc->indent,fycp_right);
  if ((((last) && (((*(byte *)sc >> 1 & 1) != 0 || (_Var1 = fy_emit_is_json_mode(emit), _Var1)))) &&
      (_Var1 = fy_emit_is_oneline(emit), !_Var1)) && ((*(byte *)sc >> 2 & 1) == 0)) {
    fy_emit_write_indent(emit,sc->old_indent);
  }
  sc->flags = sc->flags & 0xfffffffb;
  return;
}

Assistant:

static void fy_emit_mapping_value_epilog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                         bool last, struct fy_token *fyt_value) {
    if ((sc->flow || fy_emit_is_json_mode(emit)) && !last)
        fy_emit_write_indicator(emit, di_comma, sc->flags, sc->indent, fyewt_indicator);

    fy_emit_token_comment(emit, fyt_value, sc->flags, sc->indent, fycp_right);

    if (last && (sc->flow || fy_emit_is_json_mode(emit)) && !fy_emit_is_oneline(emit) && !sc->empty)
        fy_emit_write_indent(emit, sc->old_indent);

    sc->flags &= ~DDNF_MAP;
}